

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

char * classend(MatchState *ms,char *p)

{
  MatchState *pMVar1;
  MatchState *local_20;
  char *p_local;
  MatchState *ms_local;
  
  local_20 = (MatchState *)(p + 1);
  if (*p == '%') {
    if (*(char *)&local_20->src_init == '\0') {
      lj_err_caller(ms->L,LJ_ERR_STRPATE);
    }
    ms_local = (MatchState *)(p + 2);
  }
  else {
    ms_local = local_20;
    if (*p == '[') {
      if (*(char *)&local_20->src_init == '^') {
        local_20 = (MatchState *)(p + 2);
      }
      do {
        if (*(char *)&local_20->src_init == '\0') {
          lj_err_caller(ms->L,LJ_ERR_STRPATM);
        }
        pMVar1 = (MatchState *)((long)&local_20->src_init + 1);
        if ((*(char *)&local_20->src_init == '%') && (*(char *)&pMVar1->src_init != '\0')) {
          pMVar1 = (MatchState *)((long)&local_20->src_init + 2);
        }
        local_20 = pMVar1;
      } while (*(char *)&local_20->src_init != ']');
      ms_local = (MatchState *)((long)&local_20->src_init + 1);
    }
  }
  return (char *)ms_local;
}

Assistant:

static const char *classend(MatchState *ms, const char *p)
{
  switch (*p++) {
  case L_ESC:
    if (*p == '\0')
      lj_err_caller(ms->L, LJ_ERR_STRPATE);
    return p+1;
  case '[':
    if (*p == '^') p++;
    do {  /* look for a `]' */
      if (*p == '\0')
	lj_err_caller(ms->L, LJ_ERR_STRPATM);
      if (*(p++) == L_ESC && *p != '\0')
	p++;  /* skip escapes (e.g. `%]') */
    } while (*p != ']');
    return p+1;
  default:
    return p;
  }
}